

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O1

int testDcmBiasEstimator(int errorCode)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Scalar SVar22;
  double dVar23;
  Index size;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  _Elt_pointer pMVar27;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar28;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar29;
  ostream *poVar30;
  undefined8 *puVar31;
  Matrix<double,__1,_1,_0,__1,_1> *other;
  _Elt_pointer pMVar32;
  char *pcVar33;
  Index index;
  long lVar34;
  long lVar35;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar36;
  DenseStorage<double,__1,__1,_1,_0> *pDVar37;
  ActualDstType actualDst;
  long lVar38;
  ulong uVar39;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar40;
  ulong uVar41;
  _Elt_pointer pMVar42;
  _Elt_pointer pMVar43;
  long lVar44;
  ulong uVar45;
  bool bVar46;
  undefined4 uVar47;
  double dVar48;
  undefined4 uVar49;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar50;
  Scalar SVar51;
  double dVar54;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  IndexedVectorArray dcm;
  IndexedVectorArray dcm_hat;
  Vector log_k;
  IndexedVectorArray zmp_m;
  IndexedVectorArray dcm_m;
  IndexedVectorArray localBias;
  IndexedVectorArray dcm_m_unbiased;
  IndexedVectorArray gamma;
  IndexedVectorArray zmp;
  IndexedVectorArray bias_hat;
  IndexedVectorArray bias;
  vector<double,_std::allocator<double>_> kappa;
  vector<double,_std::allocator<double>_> yaw;
  IndexedVectorArray log;
  LipmDcmEstimator est;
  double local_b98;
  double dStack_b90;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b68;
  int local_b14;
  long local_b10;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_b08;
  undefined1 local_ab8 [12];
  undefined4 uStack_aac;
  undefined1 local_aa8 [8];
  double dStack_aa0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_a98;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_a90;
  long local_a88;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a80;
  long local_a30;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_a28;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_9d8;
  long local_9a8;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_9a0;
  Rotation2D<double> local_950;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_948;
  long local_8f8;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_8f0;
  long local_8a0;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_898;
  double local_848 [2];
  Rotation2D<double> local_838;
  double dStack_830;
  long local_828;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_820;
  long local_7d0;
  deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_7c8;
  undefined1 local_778 [16];
  Rotation2D<double> local_768 [2];
  vector<double,_std::allocator<double>_> local_758;
  vector<double,_std::allocator<double>_> local_740;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  double local_6f8 [24];
  undefined1 local_638 [16];
  double local_628;
  double dStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  Matrix2 local_5d8;
  double *local_5b8;
  double *local_5b0;
  undefined8 local_5a8;
  double local_98 [13];
  
  local_b14 = errorCode;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_b68,24000,(allocator_type *)&local_5d8);
  local_9a8 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_9a0,24000,(allocator_type *)&local_5d8);
  local_7d0 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_7c8,24000,(allocator_type *)&local_5d8);
  local_8a0 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_898,24000,(allocator_type *)&local_5d8);
  local_8f8 = 0;
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::deque(&local_8f0,24000,(allocator_type *)&local_5d8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_740,24000,(allocator_type *)&local_5d8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_758,24000,(allocator_type *)&local_5d8);
  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (double)(local_98 + 8);
  local_98[8] = 1.0;
  local_98[9] = 0.0;
  local_98[10] = 0.0;
  local_98[0xb] = 1.0;
  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
       (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
  pdVar25 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array + 2;
  local_5b8 = (double *)
              local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array[0];
  local_5a8 = 2;
  lVar38 = ((long)local_b68.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)local_b68.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
           ((long)local_b68.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_b68.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
           ((((ulong)((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_b68.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
           (ulong)(local_b68.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20;
  local_5b0 = pdVar25;
  if ((lVar38 == 0) || (lVar38 < 1)) goto LAB_0010747c;
  uVar39 = (long)local_b68.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur -
           (long)local_b68.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
  pMVar27 = local_b68.
            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (0x1f < uVar39) {
    uVar45 = uVar39 >> 5 | 0xf800000000000000;
    if (0 < (long)uVar39) {
      uVar45 = uVar39 >> 5;
    }
    pMVar27 = local_b68.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] + uVar39 + uVar45 * -0x20;
  }
  dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[2] *
           *(double *)
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0];
  dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[2] *
           *(double *)
            ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[0] + 8);
  dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array[3] *
           *(double *)
            ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[0] + 0x10);
  dStack_b90 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
               m_data.array[3] *
               *(double *)
                ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array[0] + 0x18);
  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      2) {
    auVar53._8_4_ = SUB84(dStack_b90,0);
    auVar53._0_8_ = dVar48;
    auVar53._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
    free((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data)
    ;
    pdVar24 = (double *)malloc(0x10);
    if (((ulong)pdVar24 & 0xf) != 0) goto LAB_001074ba;
    if (pdVar24 == (double *)0x0) {
      puVar31 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar31 = std::ios::widen;
      __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar24;
    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2;
    dStack_b90 = auVar53._8_8_;
  }
  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      2) {
    pdVar24 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data;
    *pdVar24 = (dVar48 + dVar50 + 0.0) * 4.0;
    pdVar24[1] = (dStack_b90 + dVar54 + 0.0) * 4.0;
    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = (double)(local_98 + 4);
    local_98[4] = 1.0;
    local_98[5] = 0.0;
    local_98[6] = 0.0;
    local_98[7] = 1.0;
    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
         = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
         = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
    local_5b8 = (double *)
                local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                m_data.array[0];
    local_5a8 = 2;
    lVar38 = ((long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
             ((long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
             ((((ulong)((long)local_9a0.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node -
                       (long)local_9a0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(local_9a0.
                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x20
    ;
    local_5b0 = pdVar25;
    if (((lVar38 == 0) || (0 < local_9a8)) || (lVar38 + local_9a8 < 1)) goto LAB_0010747c;
    uVar39 = ((long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_9a0.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_9a8;
    if (uVar39 < 0x20) {
      pMVar27 = local_9a0.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_9a8;
    }
    else {
      uVar45 = uVar39 >> 5 | 0xf800000000000000;
      if (0 < (long)uVar39) {
        uVar45 = uVar39 >> 5;
      }
      pMVar27 = local_9a0.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] + uVar39 + uVar45 * -0x20;
    }
    dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
             .array[2] *
             *(double *)
              local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array[0];
    dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
             .array[2] *
             *(double *)
              ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[0] + 8);
    dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
             .array[3] *
             *(double *)
              ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[0] + 0x10);
    dStack_b90 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                 m_data.array[3] *
                 *(double *)
                  ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                         m_storage.m_data.array[0] + 0x18);
    if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        != 2) {
      auVar8._8_4_ = SUB84(dStack_b90,0);
      auVar8._0_8_ = dVar48;
      auVar8._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
      free((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pdVar24 = (double *)malloc(0x10);
      if (((ulong)pdVar24 & 0xf) != 0) goto LAB_001074ba;
      if (pdVar24 == (double *)0x0) {
        puVar31 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar31 = std::ios::widen;
        __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar24;
      (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 2
      ;
      dStack_b90 = auVar8._8_8_;
    }
    if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
        == 2) {
      pdVar24 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      *pdVar24 = (dVar48 + dVar50 + 0.0) * 0.01;
      pdVar24[1] = (dStack_b90 + dVar54 + 0.0) * 0.01;
      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
      [0] = (double)local_98;
      local_98[0] = 1.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 1.0;
      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
      [2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
      [3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(1.0,0.0);
      local_5b8 = (double *)
                  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0];
      local_5a8 = 2;
      lVar38 = ((long)local_b68.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_b68.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
               ((long)local_b68.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_b68.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
               ((((ulong)((long)local_b68.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                         (long)local_b68.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(local_b68.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
               0x20;
      local_5b0 = pdVar25;
      if ((lVar38 != 0) && (0 < lVar38)) {
        uVar39 = (long)local_b68.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur -
                 (long)local_b68.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
        pMVar27 = local_b68.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (0x1f < uVar39) {
          uVar45 = uVar39 >> 5 | 0xf800000000000000;
          if (0 < (long)uVar39) {
            uVar45 = uVar39 >> 5;
          }
          pMVar27 = local_b68.
                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                    uVar39 + uVar45 * -0x20;
        }
        lVar38 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_rows;
        if (lVar38 < 0) {
LAB_0010749b:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if (lVar38 != 2) {
          pcVar33 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, 2, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, 2, 1>]"
          ;
LAB_001076cb:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar33);
        }
        lVar38 = ((long)local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                  (long)local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                 ((long)local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                 ((((ulong)((long)local_898.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_node -
                           (long)local_898.
                                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                 (ulong)(local_898.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
                 0x20;
        if (((lVar38 != 0) && (local_8a0 < 1)) && (0 < lVar38 + local_8a0)) {
          uVar39 = ((long)local_898.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_898.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_8a0;
          if (uVar39 < 0x20) {
            pMVar32 = local_898.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_8a0;
          }
          else {
            uVar45 = uVar39 >> 5 | 0xf800000000000000;
            if (0 < (long)uVar39) {
              uVar45 = uVar39 >> 5;
            }
            pMVar32 = local_898.
                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                      uVar39 + uVar45 * -0x20;
          }
          dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                    .m_data.array[0];
          dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 8);
          dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 0x10);
          dStack_b90 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array[3] *
                       *(double *)
                        ((long)local_5d8.
                               super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                               m_storage.m_data.array[0] + 0x18);
          pdVar24 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows != 2) {
            auVar9._8_4_ = SUB84(dStack_b90,0);
            auVar9._0_8_ = dVar48;
            auVar9._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
            free((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data);
            pdVar25 = (double *)malloc(0x10);
            if (((ulong)pdVar25 & 0xf) != 0) {
LAB_001074ba:
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                            "void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pdVar25 == (double *)0x0) {
              puVar31 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar31 = std::ios::widen;
              __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data = pdVar25;
            (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows = 2;
            dStack_b90 = auVar9._8_8_;
          }
          if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows != 2) {
            pcVar33 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, 2, 1>>, T1 = double, T2 = double]"
            ;
            goto LAB_0010768d;
          }
          dVar50 = (dVar48 + dVar50 + 0.0) * 0.05;
          dVar54 = (dStack_b90 + dVar54 + 0.0) * 0.05;
          dVar48 = pdVar24[1] * 1.6060915267313265 + dVar54;
          auVar10._8_4_ = SUB84(dVar48,0);
          auVar10._0_8_ = *pdVar24 * 1.6060915267313265 + dVar50;
          auVar10._12_4_ = (int)((ulong)dVar48 >> 0x20);
          *(undefined1 (*) [16])
           (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data = auVar10;
          lVar38 = 0;
          do {
            local_6f8[0x14] = 1.0;
            local_6f8[0x15] = 0.0;
            local_6f8[0x16] = 0.0;
            local_6f8[0x17] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)(local_6f8 + 0x14);
            local_728 = dVar50;
            dStack_720 = dVar54;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            pdVar25 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array + 2;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5a8 = 2;
            lVar34 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_8f0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_8f0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_8f0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            local_5b0 = pdVar25;
            if (((lVar34 == 0) || (lVar38 < local_8f8)) || (local_8f8 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_8f8);
            if (uVar39 < 0x20) {
              pMVar27 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_8f8);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x10);
            dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x18);
            dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[0];
            dVar55 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 8);
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              stack0xfffffffffffff550 =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 8);
              local_ab8._0_8_ =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                    .m_data.array[0];
              auVar11._8_4_ = SUB84(dVar48,0);
              auVar11._0_8_ = dVar50;
              auVar11._12_4_ = (int)((ulong)dVar48 >> 0x20);
              dVar48 = auVar11._8_8_;
              free((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar25 = (double *)malloc(0x10);
              if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar25 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar25;
              (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dVar54 = (double)local_ab8._0_8_;
              dVar55 = stack0xfffffffffffff550;
            }
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) goto LAB_001074d9;
            dVar48 = dVar48 + dVar55 + 0.0;
            auVar12._8_4_ = SUB84(dVar48,0);
            auVar12._0_8_ = dVar50 + dVar54 + 0.0;
            auVar12._12_4_ = (int)((ulong)dVar48 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar12;
            dVar48 = (double)stateObservation::tools::ProbabilityLawSimulation::getUniformScalar
                                       (0.5,1.5);
            local_758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar38] = dVar48;
            lVar34 = ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_b68.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_b68.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_b68.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < 0)) || (lVar34 <= lVar38)) goto LAB_0010747c;
            lVar35 = (long)local_b68.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur -
                     (long)local_b68.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
            uVar39 = lVar35 + lVar38;
            if (uVar39 < 0x20) {
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38;
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            if (uVar39 < 0x20) {
              pMVar32 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38;
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            lVar44 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_898.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_898.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_898.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar44 == 0) || (lVar38 < local_8a0)) || (local_8a0 + lVar44 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_8a0);
            if (uVar39 < 0x20) {
              pMVar42 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_8a0);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar42 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            uVar39 = (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if ((long)uVar39 < 0) goto LAB_0010749b;
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != uVar39) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
              ;
              goto LAB_001076cb;
            }
            lVar44 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_8f0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_8f0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_8f0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar44 == 0) || (lVar38 < local_8f8)) || (local_8f8 + lVar44 <= lVar38))
            goto LAB_0010747c;
            uVar45 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_8f8);
            if (uVar45 < 0x20) {
              pMVar43 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_8f8);
            }
            else {
              uVar41 = uVar45 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar45) {
                uVar41 = uVar45 >> 5;
              }
              pMVar43 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                        uVar45 + uVar41 * -0x20;
            }
            uVar45 = (pMVar43->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if (uVar39 != uVar45) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001076cb;
            }
            if ((long)uVar45 < 0) goto LAB_0010749b;
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != uVar45) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>]"
              ;
              goto LAB_001076cb;
            }
            lVar44 = lVar38 + 1;
            if ((lVar44 < 0) || (lVar34 <= lVar44)) goto LAB_0010747c;
            uVar39 = lVar35 + lVar44;
            if (uVar39 < 0x20) {
              pDVar37 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (local_b68.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar44);
            }
            else {
              uVar41 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar41 = uVar39 >> 5;
              }
              pDVar37 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (local_b68.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                        uVar39 + uVar41 * -0x20);
            }
            local_ab8._8_4_ = extraout_XMM0_Dc;
            local_ab8._0_8_ = dVar48;
            uStack_aac = extraout_XMM0_Dd;
            pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar24 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar26 = (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar6 = (pMVar43->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            if (pDVar37->m_rows != uVar45) {
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar37,uVar45,uVar45,1);
            }
            uVar39 = pDVar37->m_rows;
            if (uVar39 != uVar45) {
              pcVar33 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
              ;
              goto LAB_0010768d;
            }
            pdVar7 = pDVar37->m_data;
            uVar45 = uVar39 - ((long)uVar39 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar39) {
              lVar34 = 0;
              do {
                pdVar1 = pdVar24 + lVar34;
                dVar54 = pdVar1[1];
                pdVar4 = pdVar26 + lVar34;
                dVar55 = pdVar4[1];
                pdVar5 = pdVar6 + lVar34;
                dVar48 = pdVar5[1];
                pdVar2 = pdVar25 + lVar34;
                dVar50 = pdVar2[1];
                pdVar3 = pdVar7 + lVar34;
                *pdVar3 = ((*pdVar1 - *pdVar4 * (double)local_ab8._0_8_) + *pdVar5) *
                          0.01649915822768611 + *pdVar2;
                pdVar3[1] = ((dVar54 - dVar55 * (double)local_ab8._0_8_) + dVar48) *
                            0.01649915822768611 + dVar50;
                lVar34 = lVar34 + 2;
              } while (lVar34 < (long)uVar45);
            }
            if ((long)uVar45 < (long)uVar39) {
              do {
                pdVar7[uVar45] =
                     ((pdVar24[uVar45] - pdVar26[uVar45] * (double)local_ab8._0_8_) + pdVar6[uVar45]
                     ) * 0.01649915822768611 + pdVar25[uVar45];
                uVar45 = uVar45 + 1;
              } while (uVar39 != uVar45);
            }
            lVar34 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_9a0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_9a0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_9a0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < local_9a8)) || (local_9a8 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_9a8);
            pdVar25 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array + 2;
            if (uVar39 < 0x20) {
              pMVar27 = local_9a0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_9a8);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_9a0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            local_6f8[0x10] = 1.0;
            local_6f8[0x11] = 0.0;
            local_6f8[0x12] = 0.0;
            local_6f8[0x13] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)(local_6f8 + 0x10);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5a8 = 2;
            local_5b0 = pdVar25;
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
              ;
              goto LAB_001076cb;
            }
            lVar34 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_9a0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_9a0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_9a0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar44 < local_9a8)) || (local_9a8 + lVar34 <= lVar44))
            goto LAB_0010747c;
            uVar39 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar44 - local_9a8);
            if (uVar39 < 0x20) {
              pMVar32 = local_9a0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar44 - local_9a8);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_9a0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x18);
            pdVar24 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x10);
            dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[0];
            dVar55 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 8);
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              local_778._8_8_ =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 8);
              local_778._0_8_ =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[2] *
                   *(double *)
                    local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                    .m_data.array[0];
              local_ab8._8_4_ = SUB84(dVar48,0);
              local_ab8._0_8_ =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 0x10);
              uStack_aac = (int)((ulong)dVar48 >> 0x20);
              free((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar26 = (double *)malloc(0x10);
              if (((ulong)pdVar26 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar26 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar26;
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dVar50 = (double)local_ab8._0_8_;
              dVar48 = stack0xfffffffffffff550;
              dVar54 = (double)local_778._0_8_;
              dVar55 = (double)local_778._8_8_;
            }
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              pcVar33 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>, T1 = double, T2 = double]"
              ;
              goto LAB_0010768d;
            }
            dVar48 = (dVar48 + dVar55 + 0.0) * 0.005 * 0.005 + pdVar24[1];
            auVar13._8_4_ = SUB84(dVar48,0);
            auVar13._0_8_ = (dVar50 + dVar54 + 0.0) * 0.005 * 0.005 + *pdVar24;
            auVar13._12_4_ = (int)((ulong)dVar48 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar13;
            local_6f8[0xc] = 1.0;
            local_6f8[0xd] = 0.0;
            local_6f8[0xe] = 0.0;
            local_6f8[0xf] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)(local_6f8 + 0xc);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5a8 = 2;
            lVar34 = ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_b68.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_b68.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_b68.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            local_5b0 = pdVar25;
            if (((lVar34 == 0) || (lVar38 < 0)) || (lVar34 <= lVar38)) goto LAB_0010747c;
            uVar39 = ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar38;
            if (uVar39 < 0x20) {
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38;
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            lVar34 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if (lVar34 < 0) goto LAB_0010749b;
            lVar35 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_8f0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_8f0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_8f0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar35 == 0) || (lVar38 < local_8f8)) || (local_8f8 + lVar35 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_8f0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_8f8);
            if (uVar39 < 0x20) {
              pMVar32 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_8f8);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_8f0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            lVar35 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if (lVar34 != lVar35) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001076cb;
            }
            stack0xfffffffffffff550 =
                 (local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[3] *
                  *(double *)
                   ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array[0] + 0x18) +
                  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[2] *
                  *(double *)
                   ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array[0] + 8) + 0.0) * 0.05;
            local_ab8._0_8_ =
                 (local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[3] *
                  *(double *)
                   ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array[0] + 0x10) +
                  local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[2] *
                  *(double *)
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[0] + 0.0) * 0.05;
            if (lVar35 < 0) goto LAB_0010749b;
            dVar48 = local_758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar38];
            local_6f8[8] = 1.0;
            local_6f8[9] = 0.0;
            local_6f8[10] = 0.0;
            local_6f8[0xb] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)(local_6f8 + 8);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5a8 = 2;
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
              ;
              local_5b0 = pdVar25;
              goto LAB_001076cb;
            }
            lVar38 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_898.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_898.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_898.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            local_5b0 = pdVar25;
            if (((lVar38 == 0) || (lVar44 < local_8a0)) || (local_8a0 + lVar38 <= lVar44))
            goto LAB_0010747c;
            uVar39 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar44 - local_8a0);
            if (uVar39 < 0x20) {
              pMVar42 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar44 - local_8a0);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar42 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            dVar55 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x18);
            pdVar24 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar26 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            dVar56 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[0];
            dVar57 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 8);
            dVar23 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x10);
            if ((pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              local_778._8_4_ = SUB84(dVar55,0);
              local_778._0_8_ =
                   local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[3] *
                   *(double *)
                    ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0] + 0x10);
              local_778._12_4_ = (int)((ulong)dVar55 >> 0x20);
              local_718 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array[2] *
                          *(double *)
                           local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[0];
              dStack_710 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                           m_storage.m_data.array[2] *
                           *(double *)
                            ((long)local_5d8.
                                   super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                   m_storage.m_data.array[0] + 8);
              free((pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar25 = (double *)malloc(0x10);
              if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar25 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar25;
              (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dVar56 = local_718;
              dVar57 = dStack_710;
              dVar23 = (double)local_778._0_8_;
              dVar55 = (double)local_778._8_8_;
            }
            if ((pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              pcVar33 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>, const Eigen::Matrix<double, 2, 1>>, T1 = double, T2 = double]"
              ;
              goto LAB_0010768d;
            }
            dVar50 = local_728 + (double)local_ab8._0_8_;
            dVar54 = dStack_720 + stack0xfffffffffffff550;
            dVar55 = (dVar55 + dVar57 + 0.0) * 0.05 +
                     (pdVar24[1] * 1.6060915267313265 + pdVar26[1]) * (1.0 / dVar48) + dVar54;
            auVar14._8_4_ = SUB84(dVar55,0);
            auVar14._0_8_ =
                 (dVar23 + dVar56 + 0.0) * 0.05 +
                 (*pdVar24 * 1.6060915267313265 + *pdVar26) * (1.0 / dVar48) + dVar50;
            auVar14._12_4_ = (int)((ulong)dVar55 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar42->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar14;
            lVar38 = lVar44;
          } while (lVar44 != 23999);
          lVar34 = 0;
          lVar38 = 0;
          do {
            dVar48 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                       (6.283185307179586,0.0);
            local_740.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar38] = dVar48;
            local_950.m_angle =
                 local_740.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar38];
            lVar35 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_9a0.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_9a0.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_9a0.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar35 == 0) || (lVar38 < local_9a8)) || (lVar35 + local_9a8 <= lVar38))
            goto LAB_0010747c;
            lVar35 = ((long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_9a0.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_9a8;
            uVar39 = lVar35 + lVar38;
            if (uVar39 < 0x20) {
              pMVar29 = (Matrix<double,__1,_1,_0,__1,_1> *)
                        ((long)&local_9a0.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_9a8].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar34);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar29 = local_9a0.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        lVar35 + uVar45 * -0x20 + lVar38;
            }
            Eigen::Rotation2D<double>::toRotationMatrix(&local_5d8,&local_950);
            if ((pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                            ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                            "Eigen::Product<Eigen::Matrix<double, 2, 2>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, 2, 2>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                           );
            }
            lVar35 = ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_7c8.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_7c8.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_7c8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar35 == 0) || (lVar38 < local_7d0)) || (lVar35 + local_7d0 <= lVar38))
            goto LAB_0010747c;
            lVar35 = ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_7d0;
            uVar39 = lVar35 + lVar38;
            if (uVar39 < 0x20) {
              pMVar36 = (Matrix<double,__1,_1,_0,__1,_1> *)
                        ((long)&local_7c8.
                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_7d0].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_data + lVar34);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar36 = local_7c8.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        lVar35 + uVar45 * -0x20 + lVar38;
            }
            pdVar25 = (pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            dStack_b90 = *pdVar25;
            dVar48 = pdVar25[1];
            dVar50 = dStack_b90 *
                     local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[0];
            dStack_b90 = dStack_b90 *
                         local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                         m_storage.m_data.array[1];
            dVar54 = dVar48 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[2];
            dVar48 = dVar48 * local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>
                              .m_storage.m_data.array[3];
            if ((pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              auVar15._8_4_ = SUB84(dStack_b90,0);
              auVar15._0_8_ = dVar50;
              auVar15._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
              free((pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar25 = (double *)malloc(0x10);
              if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar25 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar25;
              (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dStack_b90 = auVar15._8_8_;
            }
            if ((pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) goto LAB_001074d9;
            dStack_b90 = dStack_b90 + dVar48;
            auVar16._8_4_ = SUB84(dStack_b90,0);
            auVar16._0_8_ = dVar50 + dVar54;
            auVar16._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar16;
            lVar38 = lVar38 + 1;
            lVar34 = lVar34 + 0x10;
          } while (lVar38 != 24000);
          local_950.m_angle = 0.0;
          std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::deque(&local_948,24000,(allocator_type *)&local_5d8);
          local_a30 = 0;
          std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::deque(&local_a28,24000,(allocator_type *)&local_5d8);
          local_a88 = 0;
          std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::deque(&local_a80,24000,(allocator_type *)&local_5d8);
          lVar38 = 0;
          do {
            lVar34 = ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_b68.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_b68.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_b68.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < 0)) || (lVar34 <= lVar38)) goto LAB_0010747c;
            uVar39 = ((long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_b68.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar38;
            if (uVar39 < 0x20) {
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38;
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_b68.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            local_6f8[4] = 1.0;
            local_6f8[5] = 0.0;
            local_6f8[6] = 0.0;
            local_6f8[7] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)(local_6f8 + 4);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5b0 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array + 2;
            local_5a8 = 2;
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
LAB_0010750d:
              local_5b0 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array + 2;
              local_5a8 = 2;
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>]"
              ;
              local_5b8 = (double *)
                          local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                          m_storage.m_data.array[0];
              goto LAB_001076cb;
            }
            lVar34 = ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_948.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_948.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_948.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < (long)local_950.m_angle)) ||
               ((long)local_950.m_angle + lVar34 <= lVar38)) goto LAB_0010747c;
            uVar39 = ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - (long)local_950.m_angle);
            if (uVar39 < 0x20) {
              pMVar32 = local_948.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur +
                        (lVar38 - (long)local_950.m_angle);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_948.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[0];
            dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 8);
            dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x10);
            dStack_b90 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                         m_storage.m_data.array[3] *
                         *(double *)
                          ((long)local_5d8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                 m_storage.m_data.array[0] + 0x18);
            pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              auVar17._8_4_ = SUB84(dStack_b90,0);
              auVar17._0_8_ = dVar48;
              auVar17._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
              free((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar24 = (double *)malloc(0x10);
              if (((ulong)pdVar24 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar24 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar24;
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dStack_b90 = auVar17._8_8_;
            }
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
LAB_001074f3:
              pcVar33 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>>, T1 = double, T2 = double]"
              ;
              goto LAB_0010768d;
            }
            dVar54 = (dStack_b90 + dVar54 + 0.0) * 0.005 + pdVar25[1];
            auVar18._8_4_ = SUB84(dVar54,0);
            auVar18._0_8_ = (dVar48 + dVar50 + 0.0) * 0.005 + *pdVar25;
            auVar18._12_4_ = (int)((ulong)dVar54 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar18;
            lVar34 = ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_948.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_948.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_948.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < (long)local_950.m_angle)) ||
               ((long)local_950.m_angle + lVar34 <= lVar38)) goto LAB_0010747c;
            uVar39 = ((long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_948.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - (long)local_950.m_angle);
            if (uVar39 < 0x20) {
              pMVar27 = local_948.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur +
                        (lVar38 - (long)local_950.m_angle);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_948.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            lVar34 = ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_7c8.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_7c8.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_7c8.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < local_7d0)) || (local_7d0 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_7c8.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_7d0);
            if (uVar39 < 0x20) {
              pMVar32 = local_7c8.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_7d0);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_7c8.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            uVar39 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows;
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != uVar39) {
              pcVar33 = 
              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
              ;
              goto LAB_001076cb;
            }
            lVar34 = ((long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_a28.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_a28.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_a28.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < local_a30)) || (local_a30 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar45 = ((long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_a30);
            if (uVar45 < 0x20) {
              pDVar37 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (local_a28.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_a30));
            }
            else {
              uVar41 = uVar45 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar45) {
                uVar41 = uVar45 >> 5;
              }
              pDVar37 = (DenseStorage<double,__1,__1,_1,_0> *)
                        (local_a28.
                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node[uVar41] +
                        uVar45 + uVar41 * -0x20);
            }
            pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar24 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            if (pDVar37->m_rows != uVar39) {
              if ((long)uVar39 < 0) {
                pcVar33 = 
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                ;
                goto LAB_0010781d;
              }
              Eigen::DenseStorage<double,_-1,_-1,_1,_0>::resize(pDVar37,uVar39,uVar39,1);
            }
            uVar45 = pDVar37->m_rows;
            if (uVar45 != uVar39) {
              pcVar33 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
              ;
              goto LAB_0010768d;
            }
            pdVar26 = pDVar37->m_data;
            uVar39 = uVar45 - ((long)uVar45 >> 0x3f) & 0xfffffffffffffffe;
            if (1 < (long)uVar45) {
              lVar34 = 0;
              do {
                pdVar6 = pdVar25 + lVar34;
                pdVar7 = pdVar24 + lVar34;
                dVar48 = pdVar6[1] + pdVar7[1];
                auVar19._8_4_ = SUB84(dVar48,0);
                auVar19._0_8_ = *pdVar6 + *pdVar7;
                auVar19._12_4_ = (int)((ulong)dVar48 >> 0x20);
                *(undefined1 (*) [16])(pdVar26 + lVar34) = auVar19;
                lVar34 = lVar34 + 2;
              } while (lVar34 < (long)uVar39);
            }
            if ((long)uVar39 < (long)uVar45) {
              do {
                pdVar26[uVar39] = pdVar25[uVar39] + pdVar24[uVar39];
                uVar39 = uVar39 + 1;
              } while (uVar45 != uVar39);
            }
            lVar34 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_898.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_898.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_898.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < local_8a0)) || (local_8a0 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_898.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_8a0);
            if (uVar39 < 0x20) {
              pMVar27 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_8a0);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_898.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            local_6f8[0] = 1.0;
            local_6f8[1] = 0.0;
            local_6f8[2] = 0.0;
            local_6f8[3] = 1.0;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[0] = (double)local_6f8;
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[3] = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                                         (1.0,0.0);
            local_5b8 = (double *)
                        local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[0];
            local_5b0 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array + 2;
            local_5a8 = 2;
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) goto LAB_0010750d;
            lVar34 = ((long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_last -
                      (long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                     ((long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                      (long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                     ((((ulong)((long)local_a80.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_node -
                               (long)local_a80.
                                     super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (ulong)(local_a80.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
                     ) * 0x20;
            if (((lVar34 == 0) || (lVar38 < local_a88)) || (local_a88 + lVar34 <= lVar38))
            goto LAB_0010747c;
            uVar39 = ((long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_a80.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                     (lVar38 - local_a88);
            if (uVar39 < 0x20) {
              pMVar32 = local_a80.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_a88);
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar32 = local_a80.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            dVar50 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[0];
            dVar54 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[2] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 8);
            dVar48 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                     m_storage.m_data.array[3] *
                     *(double *)
                      ((long)local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                             m_storage.m_data.array[0] + 0x10);
            dStack_b90 = local_5d8.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                         m_storage.m_data.array[3] *
                         *(double *)
                          ((long)local_5d8.
                                 super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                                 m_storage.m_data.array[0] + 0x18);
            pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) {
              auVar20._8_4_ = SUB84(dStack_b90,0);
              auVar20._0_8_ = dVar48;
              auVar20._12_4_ = (int)((ulong)dStack_b90 >> 0x20);
              free((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
              pdVar24 = (double *)malloc(0x10);
              if (((ulong)pdVar24 & 0xf) != 0) goto LAB_001074ba;
              if (pdVar24 == (double *)0x0) {
                puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar31 = std::ios::widen;
                __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_data = pdVar24;
              (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows = 2;
              dStack_b90 = auVar20._8_8_;
            }
            if ((pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows != 2) goto LAB_001074f3;
            dVar54 = (dStack_b90 + dVar54 + 0.0) * 0.001 + pdVar25[1];
            auVar21._8_4_ = SUB84(dVar54,0);
            auVar21._0_8_ = (dVar48 + dVar50 + 0.0) * 0.001 + *pdVar25;
            auVar21._12_4_ = (int)((ulong)dVar54 >> 0x20);
            *(undefined1 (*) [16])
             (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data = auVar21;
            lVar38 = lVar38 + 1;
          } while (lVar38 != 24000);
          local_b10 = 0;
          std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::deque(&local_b08,24000,(allocator_type *)&local_5d8);
          local_828 = 0;
          std::
          deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
          ::deque(&local_820,24000,(allocator_type *)&local_5d8);
          local_708 = 0;
          uStack_700 = 0;
          lVar38 = 0;
          do {
            *(undefined8 *)(local_638 + lVar38) = 0xbff0000000000000;
            lVar38 = lVar38 + 8;
          } while (lVar38 != 0x10);
          local_9d8._0_8_ = (Matrix *)0x0;
          local_9d8.m_xpr.m_lhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
          local_aa8 = (undefined1  [8])0x0;
          dStack_aa0 = 0.0;
          local_848[0] = 0.0;
          local_848[1] = 0.0;
          lVar38 = 0;
          do {
            *(undefined8 *)((long)&local_838.m_angle + lVar38) = 0x3f847ae147ae147b;
            lVar38 = lVar38 + 8;
          } while (lVar38 != 0x10);
          lVar38 = 0;
          do {
            *(undefined8 *)((long)&local_768[0].m_angle + lVar38) = 0x3f847ae147ae147b;
            lVar38 = lVar38 + 8;
          } while (lVar38 != 0x10);
          stateObservation::LipmDcmEstimator::LipmDcmEstimator
                    ((LipmDcmEstimator *)&local_5d8,0.005,3.2998316455372216,0.005,0.005,0.001,
                     (Matrix *)local_638,(Matrix *)&local_9d8,(Matrix *)local_aa8,
                     (Matrix *)local_848,(Matrix *)&local_838,(Matrix *)local_768);
          lVar38 = ((long)local_a28.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_a28.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                   ((long)local_a28.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_a28.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                   ((((ulong)((long)local_a28.
                                    super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    ._M_impl.super__Deque_impl_data._M_finish._M_node -
                             (long)local_a28.
                                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                   (ulong)(local_a28.
                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0))
                   * 0x20;
          if (((lVar38 != 0) && (local_a30 < 1)) && (0 < lVar38 + local_a30)) {
            uVar39 = ((long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_cur -
                      (long)local_a28.
                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_a30;
            if (uVar39 < 0x20) {
              pMVar27 = local_a28.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_a30;
            }
            else {
              uVar45 = uVar39 >> 5 | 0xf800000000000000;
              if (0 < (long)uVar39) {
                uVar45 = uVar39 >> 5;
              }
              pMVar27 = local_a28.
                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                        uVar39 + uVar45 * -0x20;
            }
            if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows == 2) {
              pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data;
              local_9d8._0_8_ = *pdVar25;
              local_9d8.m_xpr.m_lhs = (LhsNested)pdVar25[1];
              lVar38 = ((long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                       ((long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                       ((((ulong)((long)local_a80.
                                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                        ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                 (long)local_a80.
                                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1)
                       + (ulong)(local_a80.
                                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                (_Map_pointer)0x0)) * 0x20;
              if (((lVar38 == 0) || (0 < local_a88)) || (lVar38 + local_a88 < 1)) goto LAB_0010747c;
              uVar39 = ((long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur -
                        (long)local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) - local_a88;
              if (uVar39 < 0x20) {
                pMVar27 = local_a80.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur + -local_a88;
              }
              else {
                uVar45 = uVar39 >> 5 | 0xf800000000000000;
                if (0 < (long)uVar39) {
                  uVar45 = uVar39 >> 5;
                }
                pMVar27 = local_a80.
                          super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                          uVar39 + uVar45 * -0x20;
              }
              if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows == 2) {
                pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                          m_storage.m_data;
                local_aa8 = (undefined1  [8])*pdVar25;
                dStack_aa0 = pdVar25[1];
                local_838.m_angle =
                     *local_740.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
                lVar38 = 0;
                do {
                  *(undefined8 *)((long)local_848 + lVar38) = 0x3f847ae147ae147b;
                  lVar38 = lVar38 + 8;
                } while (lVar38 != 0x10);
                Eigen::Rotation2D<double>::toRotationMatrix((Matrix2 *)local_638,&local_838);
                stateObservation::LipmDcmEstimator::resetWithMeasurements
                          ((Matrix *)&local_5d8,(Matrix *)&local_9d8,(Matrix *)local_aa8,
                           SUB81(local_638,0),(Matrix *)0x1,(Matrix *)&local_708);
                local_5f8 = 0;
                uStack_5f0 = 0;
                local_608 = 0;
                uStack_600 = 0;
                local_618 = 0;
                uStack_610 = 0;
                local_628 = 0.0;
                dStack_620 = 0.0;
                local_638._0_8_ = 0.0;
                local_638._8_8_ = 0.0;
                local_5e8 = 0;
                std::
                _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::_M_initialize_map((_Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)(local_638 + 8),0);
                lVar38 = 1;
                do {
                  lVar34 = ((long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_a28.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_a28.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_a28.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_a30)) || (local_a30 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_a28.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_a30);
                  if (uVar39 < 0x20) {
                    pMVar27 = local_a28.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_a30)
                    ;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_a28.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) goto LAB_00107527;
                  pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data;
                  local_aa8 = (undefined1  [8])*pdVar25;
                  dStack_aa0 = pdVar25[1];
                  lVar34 = ((long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_a80.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_a80.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_a80.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_a88)) || (local_a88 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_a80.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_a88);
                  if (uVar39 < 0x20) {
                    pMVar27 = local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_a88)
                    ;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_a80.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) goto LAB_00107527;
                  pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data;
                  local_848[0] = *pdVar25;
                  local_848[1] = pdVar25[1];
                  lVar34 = ((long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_8f0.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_8f0.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_8f0.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 <= local_8f8)) || (lVar34 + local_8f8 < lVar38))
                  goto LAB_0010747c;
                  lVar34 = (lVar38 + -1) - local_8f8;
                  uVar39 = ((long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_8f0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar34;
                  if (uVar39 < 0x20) {
                    pMVar27 = local_8f0.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar34;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_8f0.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) goto LAB_00107527;
                  local_768[0].m_angle =
                       local_740.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar38];
                  pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data;
                  local_838.m_angle = *pdVar25;
                  dStack_830 = pdVar25[1];
                  dVar48 = local_758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar38 + -1];
                  Eigen::Rotation2D<double>::toRotationMatrix((Matrix2 *)&local_9d8,local_768);
                  stateObservation::LipmDcmEstimator::setInputs
                            ((Matrix *)&local_5d8,(Matrix *)local_aa8,(Matrix *)local_848,
                             (Matrix *)&local_9d8,dVar48);
                  stateObservation::LipmDcmEstimator::update();
                  stateObservation::LipmDcmEstimator::getBias();
                  lVar34 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_820.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_820.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_820.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_828)) || (local_828 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_828);
                  if (uVar39 < 0x20) {
                    pMVar27 = local_820.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_828)
                    ;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_820.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) {
                    free((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data);
                    pdVar25 = (double *)malloc(0x10);
                    if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
                    if (pdVar25 == (double *)0x0) {
                      puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar31 = std::ios::widen;
                      __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                    }
                    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data = pdVar25;
                    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows = 2;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) goto LAB_001074d9;
                  pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data;
                  *pdVar25 = (double)local_9d8._0_8_;
                  pdVar25[1] = (double)local_9d8.m_xpr.m_lhs;
                  stateObservation::LipmDcmEstimator::getUnbiasedDCM();
                  lVar34 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b08.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b08.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b08.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_b10)) || (local_b10 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_b10);
                  if (uVar39 < 0x20) {
                    pMVar27 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_b10)
                    ;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) {
                    free((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data);
                    pdVar25 = (double *)malloc(0x10);
                    if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
                    if (pdVar25 == (double *)0x0) {
                      puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar31 = std::ios::widen;
                      __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                    }
                    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data = pdVar25;
                    (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows = 2;
                  }
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != 2) goto LAB_001074d9;
                  pdVar25 = (pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                            ).m_storage.m_data;
                  *pdVar25 = (double)local_9d8._0_8_;
                  pdVar25[1] = (double)local_9d8.m_xpr.m_lhs;
                  lVar34 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b08.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b08.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b08.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar35 = lVar38 - local_b10, lVar38 < local_b10)) ||
                     (local_b10 + lVar34 <= lVar38)) goto LAB_0010747c;
                  uVar39 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar35;
                  if (uVar39 < 0x20) {
                    pMVar27 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar35;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar27 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  if (uVar39 < 0x20) {
                    pMVar32 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar35;
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar32 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20;
                  }
                  lVar34 = (pMVar32->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           .m_storage.m_rows;
                  if ((pMVar27->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows != lVar34) {
                    pcVar33 = 
                    "Eigen::CwiseBinaryOp<Eigen::numext::not_equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::not_equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                    ;
                    goto LAB_001076cb;
                  }
                  if (0 < lVar34) {
                    lVar35 = 0;
                    do {
                      dVar48 = (pMVar27->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[lVar35];
                      dVar50 = (pMVar32->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data[lVar35];
                      if ((dVar48 != dVar50) || (NAN(dVar48) || NAN(dVar50))) break;
                      bVar46 = lVar34 + -1 != lVar35;
                      lVar35 = lVar35 + 1;
                    } while (bVar46);
                    if ((dVar48 != dVar50) || (NAN(dVar48) || NAN(dVar50))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"NaN detected = ",0xf);
                      poVar30 = (ostream *)
                                std::ostream::operator<<((ostream *)&std::cout,(int)lVar38);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar30," ",1);
                      lVar34 = ((long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                                (long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                               ((long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                               ((((ulong)((long)local_b08.
                                                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                         (long)local_b08.
                                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                               ._M_impl.super__Deque_impl_data._M_start._M_node) >>
                                 3) - 1) +
                               (ulong)(local_b08.
                                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                      (_Map_pointer)0x0)) * 0x20;
                      if ((lVar34 == 0) || ((lVar38 < local_b10 || (local_b10 + lVar34 <= lVar38))))
                      goto LAB_0010747c;
                      uVar39 = ((long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                                (long)local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                               (lVar38 - local_b10);
                      if (uVar39 < 0x20) {
                        local_9d8._0_8_ =
                             local_b08.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar38 - local_b10);
                      }
                      else {
                        uVar45 = uVar39 >> 5 | 0xf800000000000000;
                        if (0 < (long)uVar39) {
                          uVar45 = uVar39 >> 5;
                        }
                        local_9d8._0_8_ =
                             local_b08.
                             super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                             uVar39 + uVar45 * -0x20;
                      }
                      poVar30 = Eigen::operator<<(poVar30,(
                                                  DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                                  *)&local_9d8);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar30 + -0x18) +
                                      (char)poVar30);
                      std::ostream::put((char)poVar30);
                      std::ostream::flush();
                      goto LAB_001073bc;
                    }
                  }
                  local_aa8 = (undefined1  [8])0x0;
                  dStack_aa0 = 0.0;
                  free((void *)0x0);
                  pdVar25 = (double *)malloc(0x58);
                  if (((ulong)pdVar25 & 0xf) != 0) goto LAB_001074ba;
                  if (pdVar25 == (double *)0x0) {
                    puVar31 = (undefined8 *)__cxa_allocate_exception(8);
                    *puVar31 = std::ios::widen;
                    __cxa_throw(puVar31,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                  }
                  dStack_aa0 = 5.43472210425371e-323;
                  local_9d8.m_xpr.m_lhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
                  local_9d8.m_xpr.m_rhs = (Matrix<double,__1,_1,_0,__1,_1> *)0x1;
                  local_9d8.m_xpr._16_8_ = 1;
                  *pdVar25 = (double)(int)lVar38;
                  lVar34 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_820.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_820.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_820.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  local_aa8 = (undefined1  [8])pdVar25;
                  local_9d8._0_8_ = (Matrix *)local_aa8;
                  if (((lVar34 == 0) || (lVar38 < local_828)) || (local_828 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_828);
                  if (uVar39 < 0x20) {
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_820.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur +
                              (lVar38 - local_828));
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_820.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20);
                  }
                  pCVar28 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                                      ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                                       &local_9d8,pDVar40);
                  lVar34 = ((long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_9a0.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_9a0.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_9a0.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_9a8)) || (local_9a8 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_9a0.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_9a8);
                  if (uVar39 < 0x20) {
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_9a0.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur +
                              (lVar38 - local_9a8));
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_9a0.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20);
                  }
                  pCVar28 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                                      ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                                       pCVar28,pDVar40);
                  lVar34 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b08.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b08.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b08.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < local_b10)) || (local_b10 + lVar34 <= lVar38))
                  goto LAB_0010747c;
                  uVar39 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - local_b10);
                  if (uVar39 < 0x20) {
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_b08.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur +
                              (lVar38 - local_b10));
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_b08.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20);
                  }
                  pCVar28 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                                      ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                                       pCVar28,pDVar40);
                  lVar34 = ((long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_948.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_948.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_948.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < (long)local_950.m_angle)) ||
                     ((long)local_950.m_angle + lVar34 <= lVar38)) goto LAB_0010747c;
                  uVar39 = ((long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_948.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) +
                           (lVar38 - (long)local_950.m_angle);
                  if (uVar39 < 0x20) {
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_948.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur +
                              (lVar38 - (long)local_950.m_angle));
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_948.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20);
                  }
                  pCVar28 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                                      ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)
                                       pCVar28,pDVar40);
                  lVar34 = ((long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b68.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b68.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b68.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar34 == 0) || (lVar38 < 0)) || (lVar34 <= lVar38)) goto LAB_0010747c;
                  uVar39 = ((long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + lVar38;
                  if (uVar39 < 0x20) {
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_b68.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar38);
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pDVar40 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                              (local_b68.
                               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              uVar39 + uVar45 * -0x20);
                  }
                  Eigen::CommaInitializer<Eigen::Matrix<double,-1,1,0,-1,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,_1,1,0,_1,1>> *)pCVar28,pDVar40)
                  ;
                  if (((long)&((local_9d8.m_xpr.m_lhs)->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                              m_storage.m_data + local_9d8.m_xpr._16_8_ !=
                       *(long *)(local_9d8._0_8_ + 8)) ||
                     (local_9d8.m_xpr.m_rhs != (Matrix<double,__1,_1,_0,__1,_1> *)0x1)) {
                    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  std::
                  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                  ::push_back((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)(local_638 + 8),(value_type *)local_aa8);
                  free((void *)local_aa8);
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 24000);
                local_b98 = 0.0;
                lVar34 = 0x5db6;
                lVar38 = 0x5db60;
                while( true ) {
                  lVar35 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b08.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b08.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b08.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar35 == 0) || (lVar34 < local_b10)) || (lVar35 + local_b10 <= lVar34))
                  goto LAB_0010747c;
                  lVar35 = ((long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_b08.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) -
                           local_b10;
                  uVar39 = lVar35 + lVar34;
                  if (uVar39 < 0x20) {
                    pMVar29 = (Matrix<double,__1,_1,_0,__1,_1> *)
                              ((long)&local_b08.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_b10].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data + lVar38);
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar29 = local_b08.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              lVar35 + uVar45 * -0x20 + lVar34;
                  }
                  lVar35 = ((long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_b68.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_b68.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_b68.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_b68.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar35 == 0) || (lVar34 < 0)) || (lVar35 <= lVar34)) goto LAB_0010747c;
                  lVar35 = (long)local_b68.
                                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur -
                           (long)local_b68.
                                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4;
                  uVar39 = lVar35 + lVar34;
                  if (uVar39 < 0x20) {
                    pMVar36 = (Matrix<double,__1,_1,_0,__1,_1> *)
                              ((long)&((local_b68.
                                        super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      ).m_storage.m_data + lVar38);
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar36 = local_b68.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              lVar35 + uVar45 * -0x20 + lVar34;
                  }
                  if ((pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows !=
                      (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows) break;
                  lVar35 = (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           .m_storage.m_rows;
                  local_9d8.m_xpr.m_lhs = pMVar29;
                  local_9d8.m_xpr.m_rhs = pMVar36;
                  if (lVar35 == 0) {
                    SVar51 = 0.0;
                  }
                  else {
                    if (lVar35 < 1) goto LAB_00107697;
                    local_a98.m_d.data =
                         (plainobjectbase_evaluator_data<double,_0>)
                         (pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                    local_a90.m_d.data =
                         (plainobjectbase_evaluator_data<double,_0>)
                         (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                    SVar51 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                         *)local_aa8,(scalar_sum_op<double,_double> *)local_848,
                                        &local_9d8);
                  }
                  lVar35 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_820.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_820.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_820.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar35 == 0) || (lVar34 < local_828)) || (lVar35 + local_828 <= lVar34))
                  goto LAB_0010747c;
                  lVar35 = ((long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_820.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) -
                           local_828;
                  uVar39 = lVar35 + lVar34;
                  if (uVar39 < 0x20) {
                    pMVar29 = (Matrix<double,__1,_1,_0,__1,_1> *)
                              ((long)&local_820.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_828].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data + lVar38);
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar29 = local_820.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              lVar35 + uVar45 * -0x20 + lVar34;
                  }
                  lVar35 = ((long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                            (long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) +
                           ((long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                            (long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) +
                           ((((ulong)((long)local_7c8.
                                            super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Deque_impl_data._M_finish._M_node -
                                     (long)local_7c8.
                                           super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) -
                            1) + (ulong)(local_7c8.
                                         super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node ==
                                        (_Map_pointer)0x0)) * 0x20;
                  if (((lVar35 == 0) || (lVar34 < local_7d0)) || (lVar35 + local_7d0 <= lVar34))
                  goto LAB_0010747c;
                  lVar35 = ((long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
                            (long)local_7c8.
                                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) -
                           local_7d0;
                  uVar39 = lVar35 + lVar34;
                  if (uVar39 < 0x20) {
                    pMVar36 = (Matrix<double,__1,_1,_0,__1,_1> *)
                              ((long)&local_7c8.
                                      super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur[-local_7d0].
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                      .m_storage.m_data + lVar38);
                  }
                  else {
                    uVar45 = uVar39 >> 5 | 0xf800000000000000;
                    if (0 < (long)uVar39) {
                      uVar45 = uVar39 >> 5;
                    }
                    pMVar36 = local_7c8.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_node[uVar45] +
                              lVar35 + uVar45 * -0x20 + lVar34;
                  }
                  if ((pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows !=
                      (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows) break;
                  lVar35 = (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                           .m_storage.m_rows;
                  local_9d8.m_xpr.m_lhs = pMVar29;
                  local_9d8.m_xpr.m_rhs = pMVar36;
                  if (lVar35 == 0) {
                    uVar47 = 0;
                    uVar49 = 0;
                  }
                  else {
                    if (lVar35 < 1) {
LAB_00107697:
                      __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\""
                                    ,"/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,
                                    "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                                   );
                    }
                    local_a98.m_d.data =
                         (plainobjectbase_evaluator_data<double,_0>)
                         (pMVar29->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                    local_a90.m_d.data =
                         (plainobjectbase_evaluator_data<double,_0>)
                         (pMVar36->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                         m_storage.m_data;
                    SVar22 = Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                         *)local_aa8,(scalar_sum_op<double,_double> *)local_848,
                                        &local_9d8);
                    uVar47 = SUB84(SVar22,0);
                    uVar49 = (undefined4)((ulong)SVar22 >> 0x20);
                  }
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = SVar51;
                  auVar53 = sqrtpd(auVar52,auVar52);
                  local_b98 = local_b98 + SQRT((double)CONCAT44(uVar49,uVar47)) + auVar53._0_8_;
                  lVar34 = lVar34 + 1;
                  lVar38 = lVar38 + 0x10;
                  if (lVar34 == 24000) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Sum of error on the 10 last samples = ",0x26);
                    poVar30 = std::ostream::_M_insert<double>(local_b98);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar30 + -0x18) + (char)poVar30)
                    ;
                    std::ostream::put((char)poVar30);
                    std::ostream::flush();
                    if (local_b98 <= 0.07) {
                      local_b14 = 0;
                    }
LAB_001073bc:
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)(local_638 + 8));
                    stateObservation::LipmDcmEstimator::~LipmDcmEstimator
                              ((LipmDcmEstimator *)&local_5d8);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_820);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_b08);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_a80);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_a28);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_948);
                    if (local_758.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_758.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_740.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (double *)0x0) {
                      operator_delete(local_740.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_8f0);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_898);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_7c8);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_9a0);
                    std::
                    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                    ::~deque(&local_b68);
                    return local_b14;
                  }
                }
                pcVar33 = 
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                ;
                goto LAB_001076cb;
              }
            }
LAB_00107527:
            pcVar33 = 
            "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 1>]"
            ;
LAB_0010781d:
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar33);
          }
        }
      }
LAB_0010747c:
      __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x192,
                    "void stateObservation::IndexedMatrixArrayT<Eigen::Matrix<double, -1, 1>>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, 1>, Allocator = std::allocator<Eigen::Matrix<double, -1, 1>>]"
                   );
    }
  }
  pcVar33 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Matrix<double, 2, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 2, 1>>>, T1 = double, T2 = double]"
  ;
LAB_0010768d:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar33);
LAB_001074d9:
  pcVar33 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, 2, 1>, T1 = double, T2 = double]"
  ;
  goto LAB_0010768d;
}

Assistant:

int testDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  IndexedVectorArray dcm(signallength), localBias(signallength), bias(signallength), zmp(signallength),
      gamma(signallength);
  std::vector<double> yaw(signallength), kappa(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and localBias to a random value
  dcm[0] = ran::getGaussianMatrix<Vector2>() * 4;
  double initBiasstd = 0.01;

  localBias[0] = ran::getGaussianMatrix<Vector2>() * 0.01;
  Vector2 deviation = ran::getGaussianMatrix<Vector2>() * 0.05;
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    gamma[i] = ran::getGaussianMatrix<Vector2>();
    kappa[i] = ran::getUniformScalar(0.5, 1.5);
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - kappa[i] * zmp[i] + gamma[i]);
    /// local bias drift
    localBias[i + 1] = localBias[i] + ran::getGaussianMatrix<Vector2>() * biasDriftPerSecondStd * dt;
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianMatrix<Vector2>() * 0.05;
    zmp[i + 1] = (1. / kappa[i]) * ((lambda / w0 + 1) * dcm[i] + gamma[i]) + ran::getGaussianMatrix<Vector2>() * 0.05
                 + deviation;
  }

  for(int i = 0; i < signallength; ++i)
  {
    /// global-frame bias computation
    yaw[i] = ran::getGaussianScalar(2 * M_PI);
    bias[i] = Rotation2D(yaw[i]) * localBias[i];
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  IndexedVectorArray dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {

    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianMatrix<Vector2>() * dcmMeasurementErrorStd;
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianMatrix<Vector2>() * zmpMeasurementErrorStd;
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  IndexedVectorArray dcm_hat(signallength), bias_hat(signallength);

  Vector2 initbias{0.0, 0.0};

  LipmDcmEstimator est(dt, w0, biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd);

  est.resetWithMeasurements(dcm_m[0], zmp_m[0], yaw[0], true, initbias, Vector2::Constant(initBiasstd));

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i], yaw[i], gamma[i - 1], kappa[i - 1]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      std::cout << "NaN detected = " << i << " " << dcm_hat[i].transpose() << std::endl;
      return errorCode;
    }

    Vector log_k(11);

    log_k << i, bias_hat[i], localBias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the error
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += (dcm_hat[i] - dcm[i]).norm() + (bias_hat[i] - bias[i]).norm();
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}